

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

char * ERR_getErrorString(ERR_enum code)

{
  ERR_enum code_local;
  char *local_8;
  
  switch(code) {
  case ZSTD_error_no_error:
    local_8 = "No error detected";
    break;
  case ZSTD_error_GENERIC:
    local_8 = "Error (generic)";
    break;
  case ZSTD_error_prefix_unknown:
    local_8 = "Unknown frame descriptor";
    break;
  case ZSTD_error_version_unsupported:
    local_8 = "Version not supported";
    break;
  case ZSTD_error_frameParameter_unsupported:
    local_8 = "Unsupported frame parameter";
    break;
  case ZSTD_error_frameParameter_windowTooLarge:
    local_8 = "Frame requires too much memory for decoding";
    break;
  case ZSTD_error_corruption_detected:
    local_8 = "Data corruption detected";
    break;
  case ZSTD_error_checksum_wrong:
    local_8 = "Restored data doesn\'t match checksum";
    break;
  case ZSTD_error_literals_headerWrong:
    local_8 = "Header of Literals\' block doesn\'t respect format specification";
    break;
  case ZSTD_error_dictionary_corrupted:
    local_8 = "Dictionary is corrupted";
    break;
  case ZSTD_error_dictionary_wrong:
    local_8 = "Dictionary mismatch";
    break;
  case ZSTD_error_dictionaryCreation_failed:
    local_8 = "Cannot create Dictionary from provided samples";
    break;
  case ZSTD_error_parameter_unsupported:
    local_8 = "Unsupported parameter";
    break;
  case ZSTD_error_parameter_combination_unsupported:
    local_8 = "Unsupported combination of parameters";
    break;
  case ZSTD_error_parameter_outOfBound:
    local_8 = "Parameter is out of bound";
    break;
  case ZSTD_error_tableLog_tooLarge:
    local_8 = "tableLog requires too much memory : unsupported";
    break;
  case ZSTD_error_maxSymbolValue_tooLarge:
    local_8 = "Unsupported max Symbol Value : too large";
    break;
  case ZSTD_error_maxSymbolValue_tooSmall:
    local_8 = "Specified maxSymbolValue is too small";
    break;
  case ZSTD_error_stabilityCondition_notRespected:
    local_8 = "pledged buffer stability condition is not respected";
    break;
  case ZSTD_error_stage_wrong:
    local_8 = "Operation not authorized at current processing stage";
    break;
  case ZSTD_error_init_missing:
    local_8 = "Context should be init first";
    break;
  case ZSTD_error_memory_allocation:
    local_8 = "Allocation error : not enough memory";
    break;
  case ZSTD_error_workSpace_tooSmall:
    local_8 = "workSpace buffer is not large enough";
    break;
  case ZSTD_error_dstSize_tooSmall:
    local_8 = "Destination buffer is too small";
    break;
  case ZSTD_error_srcSize_wrong:
    local_8 = "Src size is incorrect";
    break;
  case ZSTD_error_dstBuffer_null:
    local_8 = "Operation on NULL destination buffer";
    break;
  case ZSTD_error_noForwardProgress_destFull:
    local_8 = "Operation made no progress over multiple calls, due to output buffer being full";
    break;
  case ZSTD_error_noForwardProgress_inputEmpty:
    local_8 = "Operation made no progress over multiple calls, due to input being empty";
    break;
  case ZSTD_error_frameIndex_tooLarge:
    local_8 = "Frame index is too large";
    break;
  case ZSTD_error_seekableIO:
    local_8 = "An I/O error occurred when reading/seeking";
    break;
  case ZSTD_error_dstBuffer_wrong:
    local_8 = "Destination buffer is wrong";
    break;
  case ZSTD_error_srcBuffer_wrong:
    local_8 = "Source buffer is wrong";
    break;
  case ZSTD_error_sequenceProducer_failed:
    local_8 = "Block-level external sequence producer returned an error code";
    break;
  case ZSTD_error_externalSequences_invalid:
    local_8 = "External sequences are not valid";
    break;
  case ZSTD_error_maxCode:
  default:
    local_8 = "Unspecified error code";
  }
  return local_8;
}

Assistant:

const char* ERR_getErrorString(ERR_enum code)
{
#ifdef ZSTD_STRIP_ERROR_STRINGS
    (void)code;
    return "Error strings stripped";
#else
    static const char* const notErrorCode = "Unspecified error code";
    switch( code )
    {
    case PREFIX(no_error): return "No error detected";
    case PREFIX(GENERIC):  return "Error (generic)";
    case PREFIX(prefix_unknown): return "Unknown frame descriptor";
    case PREFIX(version_unsupported): return "Version not supported";
    case PREFIX(frameParameter_unsupported): return "Unsupported frame parameter";
    case PREFIX(frameParameter_windowTooLarge): return "Frame requires too much memory for decoding";
    case PREFIX(corruption_detected): return "Data corruption detected";
    case PREFIX(checksum_wrong): return "Restored data doesn't match checksum";
    case PREFIX(literals_headerWrong): return "Header of Literals' block doesn't respect format specification";
    case PREFIX(parameter_unsupported): return "Unsupported parameter";
    case PREFIX(parameter_combination_unsupported): return "Unsupported combination of parameters";
    case PREFIX(parameter_outOfBound): return "Parameter is out of bound";
    case PREFIX(init_missing): return "Context should be init first";
    case PREFIX(memory_allocation): return "Allocation error : not enough memory";
    case PREFIX(workSpace_tooSmall): return "workSpace buffer is not large enough";
    case PREFIX(stage_wrong): return "Operation not authorized at current processing stage";
    case PREFIX(tableLog_tooLarge): return "tableLog requires too much memory : unsupported";
    case PREFIX(maxSymbolValue_tooLarge): return "Unsupported max Symbol Value : too large";
    case PREFIX(maxSymbolValue_tooSmall): return "Specified maxSymbolValue is too small";
    case PREFIX(stabilityCondition_notRespected): return "pledged buffer stability condition is not respected";
    case PREFIX(dictionary_corrupted): return "Dictionary is corrupted";
    case PREFIX(dictionary_wrong): return "Dictionary mismatch";
    case PREFIX(dictionaryCreation_failed): return "Cannot create Dictionary from provided samples";
    case PREFIX(dstSize_tooSmall): return "Destination buffer is too small";
    case PREFIX(srcSize_wrong): return "Src size is incorrect";
    case PREFIX(dstBuffer_null): return "Operation on NULL destination buffer";
    case PREFIX(noForwardProgress_destFull): return "Operation made no progress over multiple calls, due to output buffer being full";
    case PREFIX(noForwardProgress_inputEmpty): return "Operation made no progress over multiple calls, due to input being empty";
        /* following error codes are not stable and may be removed or changed in a future version */
    case PREFIX(frameIndex_tooLarge): return "Frame index is too large";
    case PREFIX(seekableIO): return "An I/O error occurred when reading/seeking";
    case PREFIX(dstBuffer_wrong): return "Destination buffer is wrong";
    case PREFIX(srcBuffer_wrong): return "Source buffer is wrong";
    case PREFIX(sequenceProducer_failed): return "Block-level external sequence producer returned an error code";
    case PREFIX(externalSequences_invalid): return "External sequences are not valid";
    case PREFIX(maxCode):
    default: return notErrorCode;
    }
#endif
}